

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGen.c
# Opt level: O1

void Gia_ManObjSimAnd(Gia_Man_t *p,int iObj)

{
  uint uVar1;
  int iVar2;
  word *pwVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  
  if ((iObj < 0) || (p->nObjs <= iObj)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  uVar1 = p->nSimWords;
  uVar4 = (ulong)uVar1;
  uVar5 = uVar1 * iObj;
  if (-1 < (int)uVar5) {
    iVar2 = p->vSims->nSize;
    if ((int)uVar5 < iVar2) {
      uVar8 = *(ulong *)(p->pObjs + (uint)iObj);
      uVar7 = (uint)uVar8;
      uVar9 = (iObj - (uVar7 & 0x1fffffff)) * uVar1;
      if ((((-1 < (int)uVar9) && ((int)uVar9 < iVar2)) &&
          (uVar6 = (iObj - ((uint)(uVar8 >> 0x20) & 0x1fffffff)) * uVar1, -1 < (int)uVar6)) &&
         ((int)uVar6 < iVar2)) {
        pwVar3 = p->vSims->pArray;
        if ((uVar7 >> 0x1d & 1) != 0) {
          if ((uVar8 & 0x2000000000000000) != 0) {
            if ((int)uVar1 < 1) {
              return;
            }
            uVar8 = 0;
            do {
              pwVar3[uVar5 + uVar8] = ~(pwVar3[uVar6 + uVar8] | pwVar3[uVar9 + uVar8]);
              uVar8 = uVar8 + 1;
            } while (uVar4 != uVar8);
            return;
          }
          if ((uVar7 >> 0x1d & 1) != 0) {
            if ((int)uVar1 < 1) {
              return;
            }
            uVar8 = 0;
            do {
              pwVar3[uVar5 + uVar8] = ~pwVar3[uVar9 + uVar8] & pwVar3[uVar6 + uVar8];
              uVar8 = uVar8 + 1;
            } while (uVar4 != uVar8);
            return;
          }
        }
        if ((uVar8 & 0x2000000000000000) == 0) {
          if (0 < (int)uVar1) {
            uVar8 = 0;
            do {
              pwVar3[uVar5 + uVar8] = pwVar3[uVar6 + uVar8] & pwVar3[uVar9 + uVar8];
              uVar8 = uVar8 + 1;
            } while (uVar4 != uVar8);
          }
        }
        else if (0 < (int)uVar1) {
          uVar8 = 0;
          do {
            pwVar3[uVar5 + uVar8] = ~pwVar3[uVar6 + uVar8] & pwVar3[uVar9 + uVar8];
            uVar8 = uVar8 + 1;
          } while (uVar4 != uVar8);
        }
        return;
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
}

Assistant:

static inline void Gia_ManObjSimAnd( Gia_Man_t * p, int iObj )
{
    int w;
    Gia_Obj_t * pObj = Gia_ManObj( p, iObj );
    word * pSim  = Gia_ManObjSim( p, iObj );
    word * pSim0 = Gia_ManObjSim( p, Gia_ObjFaninId0(pObj, iObj) );
    word * pSim1 = Gia_ManObjSim( p, Gia_ObjFaninId1(pObj, iObj) );
    if ( Gia_ObjFaninC0(pObj) && Gia_ObjFaninC1(pObj) )
        for ( w = 0; w < p->nSimWords; w++ )
            pSim[w] = ~pSim0[w] & ~pSim1[w];
    else if ( Gia_ObjFaninC0(pObj) && !Gia_ObjFaninC1(pObj) )
        for ( w = 0; w < p->nSimWords; w++ )
            pSim[w] = ~pSim0[w] & pSim1[w];
    else if ( !Gia_ObjFaninC0(pObj) && Gia_ObjFaninC1(pObj) )
        for ( w = 0; w < p->nSimWords; w++ )
            pSim[w] = pSim0[w] & ~pSim1[w];
    else
        for ( w = 0; w < p->nSimWords; w++ )
            pSim[w] = pSim0[w] & pSim1[w];
}